

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

int __thiscall cmsys::RegExpFind::regmatch(RegExpFind *this,char *prog)

{
  byte bVar1;
  byte *__s2;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  byte bVar9;
  int unaff_R13D;
  byte *prog_00;
  
  if (prog != (char *)0x0) {
    do {
      if ((prog == &regdummy) ||
         (uVar3 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8,
         uVar3 == 0)) {
        prog_00 = (byte *)0x0;
      }
      else if (*prog == 7) {
        prog_00 = (byte *)prog + -(ulong)uVar3;
      }
      else {
        prog_00 = (byte *)prog + uVar3;
      }
      bVar1 = *prog;
      if (0x27 < bVar1) {
switchD_00137ca2_caseD_c:
        pcVar7 = "RegularExpression::find(): Internal error -- memory corrupted.";
        goto LAB_00137e40;
      }
      iVar5 = 1;
      switch(bVar1) {
      case 0:
        goto switchD_00137ca2_caseD_0;
      case 1:
        if (this->reginput != this->regbol) goto LAB_00137e45;
        break;
      case 2:
        if (*this->reginput != '\0') goto LAB_00137e45;
        break;
      case 3:
        pcVar7 = this->reginput;
        if (*pcVar7 != '\0') goto LAB_00137e06;
        goto LAB_00137e45;
      case 4:
        pcVar7 = this->reginput;
        if (*pcVar7 == '\0') {
          return 0;
        }
        pcVar6 = strchr((char *)((byte *)prog + 3),(int)*pcVar7);
        if (pcVar6 == (char *)0x0) {
          return 0;
        }
        goto LAB_00137e06;
      case 5:
        pcVar7 = this->reginput;
        if (*pcVar7 == '\0') {
          return 0;
        }
        pcVar6 = strchr((char *)((byte *)prog + 3),(int)*pcVar7);
        if (pcVar6 != (char *)0x0) {
          return 0;
        }
LAB_00137e06:
        this->reginput = pcVar7 + 1;
        break;
      case 6:
        bVar1 = *prog_00;
        if (bVar1 == 6) {
          while( true ) {
            pcVar7 = this->reginput;
            iVar5 = regmatch(this,(char *)((byte *)prog + 3));
            if (iVar5 != 0) break;
            this->reginput = pcVar7;
            if ((prog == &regdummy) ||
               (uVar3 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8,
               uVar3 == 0)) {
              prog = (char *)0x0;
            }
            else if (*prog == 7) {
              prog = (char *)((byte *)prog + -(ulong)uVar3);
            }
            else {
              prog = (char *)((byte *)prog + uVar3);
            }
            unaff_R13D = 0;
            if (((byte *)prog == (byte *)0x0) || (*prog != 6)) goto LAB_00137e24;
          }
          unaff_R13D = 1;
        }
        else {
          prog_00 = (byte *)prog + 3;
        }
LAB_00137e24:
        if (bVar1 == 6) {
          return unaff_R13D;
        }
        break;
      case 7:
      case 9:
        break;
      case 8:
        __s2 = (byte *)this->reginput;
        bVar2 = false;
        iVar5 = 0;
        if (((byte *)prog)[3] == *__s2) {
          __n = strlen((char *)((byte *)prog + 3));
          if (1 < __n) {
            iVar4 = strncmp((char *)((byte *)prog + 3),(char *)__s2,__n);
            bVar2 = false;
            iVar5 = 0;
            if (iVar4 != 0) goto LAB_00137d84;
          }
          this->reginput = (char *)(__s2 + __n);
          bVar2 = true;
          iVar5 = unaff_R13D;
        }
LAB_00137d84:
        unaff_R13D = iVar5;
        if (!bVar2) {
          return iVar5;
        }
        break;
      case 10:
      case 0xb:
        bVar9 = 0;
        if (*prog_00 == 8) {
          bVar9 = prog_00[3];
        }
        pcVar7 = this->reginput;
        iVar5 = regrepeat(this,(char *)((byte *)prog + 3));
        if ((int)(uint)(bVar1 != 10) <= iVar5) {
          lVar8 = (long)iVar5 + 1;
          do {
            if (((bVar9 == 0) || (bVar9 == *this->reginput)) &&
               (iVar5 = regmatch(this,(char *)prog_00), iVar5 != 0)) {
              return 1;
            }
            this->reginput = pcVar7 + lVar8 + -2;
            lVar8 = lVar8 + -1;
          } while ((long)(ulong)(bVar1 != 10) < lVar8);
        }
        goto LAB_00137e45;
      default:
        goto switchD_00137ca2_caseD_c;
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
        pcVar7 = this->reginput;
        iVar5 = regmatch(this,(char *)prog_00);
        if (iVar5 != 0) {
          if (this->regstartp[(long)(char)bVar1 + -0x14] != (char *)0x0) {
            return 1;
          }
          this->regstartp[(long)(char)bVar1 + -0x14] = pcVar7;
          return 1;
        }
        goto LAB_00137e45;
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        pcVar7 = this->reginput;
        iVar5 = regmatch(this,(char *)prog_00);
        if (iVar5 != 0) {
          if (this->regendp[(long)(char)bVar1 + -0x1e] != (char *)0x0) {
            return 1;
          }
          this->regendp[(long)(char)bVar1 + -0x1e] = pcVar7;
          return 1;
        }
        goto LAB_00137e45;
      }
      prog = (char *)prog_00;
    } while (prog_00 != (byte *)0x0);
  }
  pcVar7 = "RegularExpression::find(): Internal error -- corrupted pointers.";
LAB_00137e40:
  puts(pcVar7);
LAB_00137e45:
  iVar5 = 0;
switchD_00137ca2_caseD_0:
  return iVar5;
}

Assistant:

int RegExpFind::regmatch(const char* prog)
{
  const char* scan; // Current node.
  const char* next; // Next node.

  scan = prog;

  while (scan != KWSYS_NULLPTR) {

    next = regnext(scan);

    switch (OP(scan)) {
      case BOL:
        if (reginput != regbol)
          return (0);
        break;
      case EOL:
        if (*reginput != '\0')
          return (0);
        break;
      case ANY:
        if (*reginput == '\0')
          return (0);
        reginput++;
        break;
      case EXACTLY: {
        size_t len;
        const char* opnd;

        opnd = OPERAND(scan);
        // Inline the first character, for speed.
        if (*opnd != *reginput)
          return (0);
        len = strlen(opnd);
        if (len > 1 && strncmp(opnd, reginput, len) != 0)
          return (0);
        reginput += len;
      } break;
      case ANYOF:
        if (*reginput == '\0' ||
            strchr(OPERAND(scan), *reginput) == KWSYS_NULLPTR)
          return (0);
        reginput++;
        break;
      case ANYBUT:
        if (*reginput == '\0' ||
            strchr(OPERAND(scan), *reginput) != KWSYS_NULLPTR)
          return (0);
        reginput++;
        break;
      case NOTHING:
        break;
      case BACK:
        break;
      case OPEN + 1:
      case OPEN + 2:
      case OPEN + 3:
      case OPEN + 4:
      case OPEN + 5:
      case OPEN + 6:
      case OPEN + 7:
      case OPEN + 8:
      case OPEN + 9: {
        int no;
        const char* save;

        no = OP(scan) - OPEN;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set startp if some later invocation of the
          // same parentheses already has.
          //
          if (regstartp[no] == KWSYS_NULLPTR)
            regstartp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case CLOSE + 1:
      case CLOSE + 2:
      case CLOSE + 3:
      case CLOSE + 4:
      case CLOSE + 5:
      case CLOSE + 6:
      case CLOSE + 7:
      case CLOSE + 8:
      case CLOSE + 9: {
        int no;
        const char* save;

        no = OP(scan) - CLOSE;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set endp if some later invocation of the
          // same parentheses already has.
          //
          if (regendp[no] == KWSYS_NULLPTR)
            regendp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case BRANCH: {

        const char* save;

        if (OP(next) != BRANCH) // No choice.
          next = OPERAND(scan); // Avoid recursion.
        else {
          do {
            save = reginput;
            if (regmatch(OPERAND(scan)))
              return (1);
            reginput = save;
            scan = regnext(scan);
          } while (scan != KWSYS_NULLPTR && OP(scan) == BRANCH);
          return (0);
          // NOTREACHED
        }
      } break;
      case STAR:
      case PLUS: {
        char nextch;
        int no;
        const char* save;
        int min_no;

        //
        // Lookahead to avoid useless match attempts when we know
        // what character comes next.
        //
        nextch = '\0';
        if (OP(next) == EXACTLY)
          nextch = *OPERAND(next);
        min_no = (OP(scan) == STAR) ? 0 : 1;
        save = reginput;
        no = regrepeat(OPERAND(scan));
        while (no >= min_no) {
          // If it could work, try it.
          if (nextch == '\0' || *reginput == nextch)
            if (regmatch(next))
              return (1);
          // Couldn't or didn't -- back up.
          no--;
          reginput = save + no;
        }
        return (0);
      }
      //              break;
      case END:
        return (1); // Success!

      default:
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf(
          "RegularExpression::find(): Internal error -- memory corrupted.\n");
        return 0;
    }
    scan = next;
  }

  //
  //  We get here only if there's trouble -- normally "case END" is the
  //  terminating point.
  //
  // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
  printf("RegularExpression::find(): Internal error -- corrupted pointers.\n");
  return (0);
}